

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::SerializedResourceSignatureImpl::IsCompatible
          (SerializedResourceSignatureImpl *this,SerializedResourceSignatureImpl *Rhs,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags)

{
  DeviceType Type;
  int iVar1;
  IPipelineResourceSignature *pIVar2;
  IPipelineResourceSignature *pIVar3;
  ARCHIVE_DEVICE_DATA_FLAGS AVar4;
  
  do {
    do {
      AVar4 = DeviceFlags;
      if (AVar4 == ARCHIVE_DEVICE_DATA_FLAG_NONE) goto LAB_001e1a5b;
      Type = ArchiveDeviceDataFlagToArchiveDeviceType(-AVar4 & AVar4);
      pIVar2 = GetDeviceSignature(this,Type);
      pIVar3 = GetDeviceSignature(Rhs,Type);
      if ((pIVar2 == (IPipelineResourceSignature *)0x0) ==
          (pIVar3 != (IPipelineResourceSignature *)0x0)) goto LAB_001e1a5b;
      DeviceFlags = -AVar4 & AVar4 ^ AVar4;
    } while (pIVar2 == (IPipelineResourceSignature *)0x0 ||
             pIVar3 == (IPipelineResourceSignature *)0x0);
    iVar1 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[0xf])(pIVar2,pIVar3);
  } while ((char)iVar1 != '\0');
LAB_001e1a5b:
  return AVar4 == ARCHIVE_DEVICE_DATA_FLAG_NONE;
}

Assistant:

bool SerializedResourceSignatureImpl::IsCompatible(const SerializedResourceSignatureImpl& Rhs, ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags) const
{
    while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
    {
        const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
        const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

        const auto* pPRS0 = GetDeviceSignature(ArchiveDeviceType);
        const auto* pPRS1 = Rhs.GetDeviceSignature(ArchiveDeviceType);
        if ((pPRS0 == nullptr) != (pPRS1 == nullptr))
            return false;

        if ((pPRS0 != nullptr) && (pPRS1 != nullptr) && !pPRS0->IsCompatibleWith(pPRS1))
            return false;
    }
    return true;
}